

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

uint16 crnd::dxt1_block::pack_color(uint32 r,uint32 g,uint32 b,bool scaled,uint32 bias)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0xff;
  if (r < 0xff) {
    uVar1 = r;
  }
  uVar2 = 0xff;
  if (g < 0xff) {
    uVar2 = g;
  }
  uVar4 = 0xff;
  if (b < 0xff) {
    uVar4 = b;
  }
  uVar3 = 0;
  if ((int)r < 0) {
    uVar1 = uVar3;
  }
  if ((int)g < 0) {
    uVar2 = uVar3;
  }
  if ((int)b < 0) {
    uVar4 = uVar3;
  }
  if ((int)CONCAT71(in_register_00000009,scaled) != 0) {
    uVar1 = (uVar1 * 0x1f + bias) / 0xff;
    uVar2 = (uVar2 * 0x3f + bias) / 0xff;
    uVar4 = (uVar4 * 0x1f + bias) / 0xff;
  }
  if (0x1e < uVar1) {
    uVar1 = 0x1f;
  }
  uVar3 = 0x3f;
  if (uVar2 < 0x3f) {
    uVar3 = uVar2;
  }
  uVar2 = 0x1f;
  if (uVar4 < 0x1f) {
    uVar2 = uVar4;
  }
  return (ushort)(uVar1 << 0xb) | (ushort)(uVar3 << 5) | (ushort)uVar2;
}

Assistant:

uint16 dxt1_block::pack_color(uint32 r, uint32 g, uint32 b, bool scaled, uint32 bias)
    {
        return pack_color(color_quad_u8(r, g, b, 0), scaled, bias);
    }